

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O0

int it_mtm_read_sample_header(IT_SAMPLE *sample,DUMBFILE *f)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  DUMBFILE *in_RSI;
  long in_RDI;
  int flags;
  int finetune;
  DUMBFILE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),in_RSI);
  *(undefined1 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)(in_RDI + 0x23) = 0;
  iVar1 = dumbfile_igetl(in_stack_ffffffffffffffd8);
  *(int32 *)(in_RDI + 0x38) = iVar1;
  iVar1 = dumbfile_igetl(in_stack_ffffffffffffffd8);
  *(int32 *)(in_RDI + 0x3c) = iVar1;
  iVar1 = dumbfile_igetl(in_stack_ffffffffffffffd8);
  *(int32 *)(in_RDI + 0x40) = iVar1;
  iVar2 = dumbfile_getc(in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 0x33) = 0x40;
  iVar3 = dumbfile_getc(in_stack_ffffffffffffffd8);
  *(char *)(in_RDI + 0x34) = (char)iVar3;
  uVar4 = dumbfile_getc(in_stack_ffffffffffffffd8);
  if (*(int *)(in_RDI + 0x38) < 1) {
    *(undefined1 *)(in_RDI + 0x32) = 0;
    iVar2 = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x32) = 1;
    if ((uVar4 & 1) != 0) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 2;
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) >> 1;
      *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) >> 1;
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) >> 1;
    }
    *(undefined1 *)(in_RDI + 0x35) = 0;
    *(undefined4 *)(in_RDI + 0x44) = 0x40be;
    *(short *)(in_RDI + 0x54) = (short)(((int)(char)(iVar2 << 4) >> 4) << 5);
    if (*(int *)(in_RDI + 0x38) < *(int *)(in_RDI + 0x40)) {
      *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x38);
    }
    if (2 < *(int *)(in_RDI + 0x40) - *(int *)(in_RDI + 0x3c)) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x10;
    }
    *(undefined1 *)(in_RDI + 0x50) = 0;
    *(undefined1 *)(in_RDI + 0x51) = 0;
    *(undefined1 *)(in_RDI + 0x52) = 0;
    *(undefined1 *)(in_RDI + 0x53) = 0;
    *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
    iVar2 = dumbfile_error(in_RSI);
  }
  return iVar2;
}

Assistant:

static int it_mtm_read_sample_header(IT_SAMPLE *sample, DUMBFILE *f)
{
	int finetune, flags;

    dumbfile_getnc((char *)sample->name, 22, f);
	sample->name[22] = 0;

	sample->filename[0] = 0;

	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);
	finetune = (signed char)(dumbfile_getc(f) << 4) >> 4; /* signed nibble */
	sample->global_volume = 64;
	sample->default_volume = dumbfile_getc(f);

	flags = dumbfile_getc(f);

	if (sample->length <= 0) {
		sample->flags = 0;
		return 0;
	}

	sample->flags = IT_SAMPLE_EXISTS;

	if (flags & 1) {
		sample->flags |= IT_SAMPLE_16BIT;
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}

	sample->default_pan = 0;
	sample->C5_speed = (int)( AMIGA_CLOCK / 214.0 );//(long)(16726.0*pow(DUMB_PITCH_BASE, finetune*32));
	sample->finetune = finetune * 32;
	// the above line might be wrong

	if (sample->loop_end > sample->length)
		sample->loop_end = sample->length;

	if (sample->loop_end - sample->loop_start > 2)
		sample->flags |= IT_SAMPLE_LOOP;

	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = 0; // do we have to set _all_ these?
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}